

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_classifier.h
# Opt level: O0

int Classifier_match(Classifier *me,char *suffix,exr_pixel_type_t type)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined4 local_4;
  
  if (*(int *)((long)in_RDI + 0xc) == in_EDX) {
    if (*(short *)((long)in_RDI + 0x14) == 0) {
      iVar1 = strcmp(in_RSI,(char *)*in_RDI);
      local_4 = (uint)(iVar1 == 0);
    }
    else {
      iVar1 = strcasecmp(in_RSI,(char *)*in_RDI);
      local_4 = (uint)(iVar1 == 0);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int
Classifier_match (
    const Classifier* me, const char* suffix, const exr_pixel_type_t type)
{
    if (me->_type != type) return DWA_CLASSIFIER_FALSE;
#ifdef _MSC_VER
    if (me->_caseInsensitive) return _stricmp (suffix, me->_suffix) == 0;
#else
    if (me->_caseInsensitive) return strcasecmp (suffix, me->_suffix) == 0;
#endif

    return strcmp (suffix, me->_suffix) == 0;
}